

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.h
# Opt level: O0

void __thiscall FIX::HttpMessage::HttpMessage(HttpMessage *this,HttpMessage *copy)

{
  HttpMessage *copy_local;
  HttpMessage *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_parameters);
  std::__cxx11::string::operator=((string *)this,(string *)copy);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&this->m_parameters,&copy->m_parameters);
  return;
}

Assistant:

HttpMessage(const HttpMessage &copy) {
    m_root = copy.m_root;
    m_parameters = copy.m_parameters;
  }